

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

void __thiscall helics::ValueFederateManager::clearUpdates(ValueFederateManager *this)

{
  BlockIterator<helics::Input,_32,_helics::Input_**> local_78;
  handle local_60;
  iterator local_48;
  iterator local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&local_60,&this->inputs);
  gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::begin
            (&local_30,&(local_60.data)->dataStorage);
  gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
            (&local_48,&(local_60.data)->dataStorage);
  local_78.vec = local_30.vec;
  local_78.ptr = local_30.ptr;
  local_78.offset = local_30.offset;
  local_78._20_4_ = local_30._20_4_;
  while ((local_78.offset != local_48.offset || (local_78.vec != local_48.vec))) {
    Input::clearUpdate(local_78.ptr);
    gmlc::containers::BlockIterator<helics::Input,_32,_helics::Input_**>::operator++(&local_78);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_60.m_handle_lock);
  return;
}

Assistant:

void ValueFederateManager::clearUpdates()
{
    inputs.lock()->apply([](auto& inp) { inp.clearUpdate(); });
}